

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbolNotEnforcingDepsHelper
          (DescriptorBuilder *this,DescriptorPool *pool,string *name,bool build_it)

{
  bool bVar1;
  Tables *pTVar2;
  Mutex *mu;
  Type TVar4;
  Symbol SVar5;
  MutexLockMaybe lock;
  anon_union_8_8_13f84498_for_Symbol_2 aVar3;
  
  if (this->pool_ == pool) {
    mu = (Mutex *)0x0;
  }
  else {
    mu = pool->mutex_;
  }
  internal::MutexLockMaybe::MutexLockMaybe(&lock,mu);
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                     (&pool->tables_);
  SVar5 = DescriptorPool::Tables::FindSymbol(pTVar2,name);
  aVar3 = SVar5.field_1;
  TVar4 = SVar5.type;
  if (TVar4 == NULL_SYMBOL) {
    if (pool->underlay_ == (DescriptorPool *)0x0) {
      TVar4 = NULL_SYMBOL;
    }
    else {
      SVar5 = FindSymbolNotEnforcingDepsHelper(this,pool->underlay_,name,true);
      aVar3 = SVar5.field_1;
      TVar4 = SVar5.type;
    }
    if (build_it && TVar4 == NULL_SYMBOL) {
      bVar1 = DescriptorPool::TryFindSymbolInFallbackDatabase(pool,name);
      TVar4 = NULL_SYMBOL;
      if (bVar1) {
        pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                           (&pool->tables_);
        SVar5 = DescriptorPool::Tables::FindSymbol(pTVar2,name);
        aVar3 = SVar5.field_1;
        TVar4 = SVar5.type;
      }
    }
  }
  internal::MutexLockMaybe::~MutexLockMaybe(&lock);
  SVar5._4_4_ = 0;
  SVar5.type = TVar4;
  SVar5.field_1.descriptor = aVar3.descriptor;
  return SVar5;
}

Assistant:

Symbol DescriptorBuilder::FindSymbolNotEnforcingDepsHelper(
    const DescriptorPool* pool, const string& name, bool build_it) {
  // If we are looking at an underlay, we must lock its mutex_, since we are
  // accessing the underlay's tables_ directly.
  MutexLockMaybe lock((pool == pool_) ? NULL : pool->mutex_);

  Symbol result = pool->tables_->FindSymbol(name);
  if (result.IsNull() && pool->underlay_ != NULL) {
    // Symbol not found; check the underlay.
    result = FindSymbolNotEnforcingDepsHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // With lazily_build_dependencies_, a symbol lookup at cross link time is
    // not guaranteed to be successful. In most cases, build_it will be false,
    // which intentionally prevents us from building an import until it's
    // actually needed. In some cases, like registering an extension, we want
    // to build the file containing the symbol, and build_it will be set.
    // Also, build_it will be true when !lazily_build_dependencies_, to provide
    // better error reporting of missing dependencies.
    if (build_it && pool->TryFindSymbolInFallbackDatabase(name)) {
      result = pool->tables_->FindSymbol(name);
    }
  }

  return result;
}